

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamAlignment.cpp
# Opt level: O1

bool __thiscall
BamTools::BamAlignment::SkipToNextTag
          (BamAlignment *this,char storageType,char **pTagData,uint *numBytesParsed)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte __rhs;
  bool bVar2;
  char *pcVar3;
  byte *pbVar4;
  long *plVar5;
  size_type *psVar6;
  uint uVar7;
  undefined7 in_register_00000031;
  int iVar8;
  uint uVar9;
  string message;
  string local_58;
  string local_38;
  ulong uVar10;
  
  iVar8 = (int)CONCAT71(in_register_00000031,storageType);
  if (iVar8 < 0x53) {
    switch(iVar8) {
    case 0x41:
    case 0x43:
switchD_0019fd24_caseD_41:
      *numBytesParsed = *numBytesParsed + 1;
      *pTagData = *pTagData + 1;
      break;
    case 0x42:
      pbVar4 = (byte *)*pTagData;
      __rhs = *pbVar4;
      uVar7 = *numBytesParsed;
      *numBytesParsed = uVar7 + 1;
      *pTagData = (char *)(pbVar4 + 1);
      iVar8 = *(int *)(pbVar4 + 1);
      uVar7 = uVar7 + 5;
      *numBytesParsed = uVar7;
      *pTagData = (char *)(pbVar4 + 5);
      uVar9 = __rhs - 0x43;
      uVar10 = (ulong)uVar9;
      if (uVar9 < 0x31) {
        if ((0x4800000040U >> (uVar10 & 0x3f) & 1) == 0) {
          if ((0x100000001U >> (uVar10 & 0x3f) & 1) == 0) {
            if ((0x1000000010000U >> (uVar10 & 0x3f) & 1) == 0) goto LAB_0019feeb;
            iVar8 = iVar8 * 2;
          }
        }
        else {
          iVar8 = iVar8 << 2;
        }
        *numBytesParsed = uVar7 + iVar8;
        pbVar4 = pbVar4 + 5 + iVar8;
        goto LAB_0019fe62;
      }
LAB_0019feeb:
      paVar1 = &local_58.field_2;
      local_58._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,"invalid binary array type: ","");
      std::operator+(&local_38,&local_58,__rhs);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != paVar1) {
        operator_delete(local_58._M_dataplus._M_p);
      }
      local_58._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,"BamAlignment::SkipToNextTag","");
      SetErrorString(this,&local_58,&local_38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != paVar1) {
        operator_delete(local_58._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) goto LAB_0019fedf;
      goto LAB_0019fee4;
    default:
      goto switchD_0019fd24_caseD_44;
    case 0x48:
switchD_0019fd24_caseD_48:
      pcVar3 = *pTagData;
      if (*pcVar3 != '\0') {
        uVar7 = *numBytesParsed;
        do {
          pcVar3 = pcVar3 + 1;
          uVar7 = uVar7 + 1;
          *numBytesParsed = uVar7;
          *pTagData = pcVar3;
        } while (*pcVar3 != '\0');
      }
      *numBytesParsed = *numBytesParsed + 1;
      pbVar4 = (byte *)(pcVar3 + 1);
LAB_0019fe62:
      *pTagData = (char *)pbVar4;
      break;
    case 0x49:
switchD_0019fd24_caseD_49:
      *numBytesParsed = *numBytesParsed + 4;
      *pTagData = *pTagData + 4;
    }
LAB_0019fe65:
    bVar2 = true;
  }
  else {
    if (iVar8 < 0x66) {
      if (iVar8 == 0x53) {
LAB_0019fd46:
        *numBytesParsed = *numBytesParsed + 2;
        *pTagData = *pTagData + 2;
        goto LAB_0019fe65;
      }
      if (iVar8 == 0x5a) goto switchD_0019fd24_caseD_48;
      if (iVar8 == 99) goto switchD_0019fd24_caseD_41;
    }
    else {
      if ((iVar8 == 0x66) || (iVar8 == 0x69)) goto switchD_0019fd24_caseD_49;
      if (iVar8 == 0x73) goto LAB_0019fd46;
    }
switchD_0019fd24_caseD_44:
    paVar1 = &local_58.field_2;
    local_58._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"invalid tag type: ","");
    plVar5 = (long *)std::__cxx11::string::_M_replace_aux
                               ((ulong)&local_58,local_58._M_string_length,0,'\x01');
    psVar6 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_38.field_2._M_allocated_capacity = *psVar6;
      local_38.field_2._8_8_ = plVar5[3];
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    }
    else {
      local_38.field_2._M_allocated_capacity = *psVar6;
      local_38._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_38._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    local_58._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"BamAlignment::SkipToNextTag","");
    SetErrorString(this,&local_58,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
LAB_0019fedf:
      operator_delete(local_38._M_dataplus._M_p);
    }
LAB_0019fee4:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool BamAlignment::SkipToNextTag(const char storageType, char*& pTagData,
                                 unsigned int& numBytesParsed) const
{
    switch (storageType) {

        case (Constants::BAM_TAG_TYPE_ASCII):
        case (Constants::BAM_TAG_TYPE_INT8):
        case (Constants::BAM_TAG_TYPE_UINT8):
            ++numBytesParsed;
            ++pTagData;
            break;

        case (Constants::BAM_TAG_TYPE_INT16):
        case (Constants::BAM_TAG_TYPE_UINT16):
            numBytesParsed += sizeof(uint16_t);
            pTagData += sizeof(uint16_t);
            break;

        case (Constants::BAM_TAG_TYPE_FLOAT):
        case (Constants::BAM_TAG_TYPE_INT32):
        case (Constants::BAM_TAG_TYPE_UINT32):
            numBytesParsed += sizeof(uint32_t);
            pTagData += sizeof(uint32_t);
            break;

        case (Constants::BAM_TAG_TYPE_STRING):
        case (Constants::BAM_TAG_TYPE_HEX):
            while (*pTagData) {
                ++numBytesParsed;
                ++pTagData;
            }
            // increment for null-terminator
            ++numBytesParsed;
            ++pTagData;
            break;

        case (Constants::BAM_TAG_TYPE_ARRAY):

        {
            // read array type
            const char arrayType = *pTagData;
            ++numBytesParsed;
            ++pTagData;

            // read number of elements
            int32_t numElements;
            memcpy(&numElements, pTagData, sizeof(uint32_t));  // already endian-swapped, if needed
            numBytesParsed += sizeof(uint32_t);
            pTagData += sizeof(uint32_t);

            // calculate number of bytes to skip
            int bytesToSkip = 0;
            switch (arrayType) {
                case (Constants::BAM_TAG_TYPE_INT8):
                case (Constants::BAM_TAG_TYPE_UINT8):
                    bytesToSkip = numElements;
                    break;
                case (Constants::BAM_TAG_TYPE_INT16):
                case (Constants::BAM_TAG_TYPE_UINT16):
                    bytesToSkip = numElements * sizeof(uint16_t);
                    break;
                case (Constants::BAM_TAG_TYPE_FLOAT):
                case (Constants::BAM_TAG_TYPE_INT32):
                case (Constants::BAM_TAG_TYPE_UINT32):
                    bytesToSkip = numElements * sizeof(uint32_t);
                    break;
                default:
                    const std::string message =
                        std::string("invalid binary array type: ") + arrayType;
                    SetErrorString("BamAlignment::SkipToNextTag", message);
                    return false;
            }

            // skip binary array contents
            numBytesParsed += bytesToSkip;
            pTagData += bytesToSkip;
            break;
        }

        default:
            const std::string message = std::string("invalid tag type: ") + storageType;
            SetErrorString("BamAlignment::SkipToNextTag", message);
            return false;
    }

    // if we get here, tag skipped OK - return success
    return true;
}